

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

char * argon2_error_message(int error_code)

{
  char *pcStack_10;
  int error_code_local;
  
  switch(error_code) {
  case 0:
    pcStack_10 = "OK";
    break;
  case -0x23:
    pcStack_10 = "The password does not match the supplied hash";
    break;
  case -0x22:
    pcStack_10 = "Some of encoded parameters are too long or too short";
    break;
  case -0x21:
    pcStack_10 = "Threading failure";
    break;
  case -0x20:
    pcStack_10 = "Decoding failed";
    break;
  case -0x1f:
    pcStack_10 = "Encoding failed";
    break;
  case -0x1e:
    pcStack_10 = "Missing arguments";
    break;
  case -0x1d:
    pcStack_10 = "Too many threads";
    break;
  case -0x1c:
    pcStack_10 = "Not enough threads";
    break;
  case -0x1b:
    pcStack_10 = "Output pointer mismatch";
    break;
  case -0x1a:
    pcStack_10 = "There is no such version of Argon2";
    break;
  case -0x19:
    pcStack_10 = "Argon2_Context context is NULL";
    break;
  case -0x18:
    pcStack_10 = "The allocate memory callback is NULL";
    break;
  case -0x17:
    pcStack_10 = "The free memory callback is NULL";
    break;
  case -0x16:
    pcStack_10 = "Memory allocation error";
    break;
  case -0x15:
    pcStack_10 = "Associated data pointer is NULL, but ad length is not 0";
    break;
  case -0x14:
    pcStack_10 = "Secret pointer is NULL, but secret length is not 0";
    break;
  case -0x13:
    pcStack_10 = "Salt pointer is NULL, but salt length is not 0";
    break;
  case -0x12:
    pcStack_10 = "Password pointer is NULL, but password length is not 0";
    break;
  case -0x11:
    pcStack_10 = "Too many lanes";
    break;
  case -0x10:
    pcStack_10 = "Too few lanes";
    break;
  case -0xf:
    pcStack_10 = "Memory cost is too large";
    break;
  case -0xe:
    pcStack_10 = "Memory cost is too small";
    break;
  case -0xd:
    pcStack_10 = "Time cost is too large";
    break;
  case -0xc:
    pcStack_10 = "Time cost is too small";
    break;
  case -0xb:
    pcStack_10 = "Secret is too long";
    break;
  case -10:
    pcStack_10 = "Secret is too short";
    break;
  case -9:
    pcStack_10 = "Associated data is too long";
    break;
  case -8:
    pcStack_10 = "Associated data is too short";
    break;
  case -7:
    pcStack_10 = "Salt is too long";
    break;
  case -6:
    pcStack_10 = "Salt is too short";
    break;
  case -5:
    pcStack_10 = "Password is too long";
    break;
  case -4:
    pcStack_10 = "Password is too short";
    break;
  case -3:
    pcStack_10 = "Output is too long";
    break;
  case -2:
    pcStack_10 = "Output is too short";
    break;
  case -1:
    pcStack_10 = "Output pointer is NULL";
    break;
  default:
    pcStack_10 = "Unknown error code";
  }
  return pcStack_10;
}

Assistant:

const char *argon2_error_message(int error_code) {
    switch (error_code) {
    case ARGON2_OK:
        return "OK";
    case ARGON2_OUTPUT_PTR_NULL:
        return "Output pointer is NULL";
    case ARGON2_OUTPUT_TOO_SHORT:
        return "Output is too short";
    case ARGON2_OUTPUT_TOO_LONG:
        return "Output is too long";
    case ARGON2_PWD_TOO_SHORT:
        return "Password is too short";
    case ARGON2_PWD_TOO_LONG:
        return "Password is too long";
    case ARGON2_SALT_TOO_SHORT:
        return "Salt is too short";
    case ARGON2_SALT_TOO_LONG:
        return "Salt is too long";
    case ARGON2_AD_TOO_SHORT:
        return "Associated data is too short";
    case ARGON2_AD_TOO_LONG:
        return "Associated data is too long";
    case ARGON2_SECRET_TOO_SHORT:
        return "Secret is too short";
    case ARGON2_SECRET_TOO_LONG:
        return "Secret is too long";
    case ARGON2_TIME_TOO_SMALL:
        return "Time cost is too small";
    case ARGON2_TIME_TOO_LARGE:
        return "Time cost is too large";
    case ARGON2_MEMORY_TOO_LITTLE:
        return "Memory cost is too small";
    case ARGON2_MEMORY_TOO_MUCH:
        return "Memory cost is too large";
    case ARGON2_LANES_TOO_FEW:
        return "Too few lanes";
    case ARGON2_LANES_TOO_MANY:
        return "Too many lanes";
    case ARGON2_PWD_PTR_MISMATCH:
        return "Password pointer is NULL, but password length is not 0";
    case ARGON2_SALT_PTR_MISMATCH:
        return "Salt pointer is NULL, but salt length is not 0";
    case ARGON2_SECRET_PTR_MISMATCH:
        return "Secret pointer is NULL, but secret length is not 0";
    case ARGON2_AD_PTR_MISMATCH:
        return "Associated data pointer is NULL, but ad length is not 0";
    case ARGON2_MEMORY_ALLOCATION_ERROR:
        return "Memory allocation error";
    case ARGON2_FREE_MEMORY_CBK_NULL:
        return "The free memory callback is NULL";
    case ARGON2_ALLOCATE_MEMORY_CBK_NULL:
        return "The allocate memory callback is NULL";
    case ARGON2_INCORRECT_PARAMETER:
        return "Argon2_Context context is NULL";
    case ARGON2_INCORRECT_TYPE:
        return "There is no such version of Argon2";
    case ARGON2_OUT_PTR_MISMATCH:
        return "Output pointer mismatch";
    case ARGON2_THREADS_TOO_FEW:
        return "Not enough threads";
    case ARGON2_THREADS_TOO_MANY:
        return "Too many threads";
    case ARGON2_MISSING_ARGS:
        return "Missing arguments";
    case ARGON2_ENCODING_FAIL:
        return "Encoding failed";
    case ARGON2_DECODING_FAIL:
        return "Decoding failed";
    case ARGON2_THREAD_FAIL:
        return "Threading failure";
    case ARGON2_DECODING_LENGTH_FAIL:
        return "Some of encoded parameters are too long or too short";
    case ARGON2_VERIFY_MISMATCH:
        return "The password does not match the supplied hash";
    default:
        return "Unknown error code";
    }
}